

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findfunction.cpp
# Opt level: O1

int node_width(string *name_node,datanode *node,string *type_name)

{
  size_t sVar1;
  size_t __n;
  pointer pcVar2;
  int iVar3;
  string *psVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  string name_node_1;
  
  iVar3 = 0x110348;
  uVar5 = (ulong)nodepointer;
  bVar7 = 0 < (long)uVar5;
  if (0 < (long)uVar5) {
    sVar1 = name_node->_M_string_length;
    uVar6 = 1;
    do {
      __n = (node->name)._M_string_length;
      if ((__n == sVar1) &&
         ((__n == 0 ||
          (iVar3 = bcmp((node->name)._M_dataplus._M_p,(name_node->_M_dataplus)._M_p,__n), iVar3 == 0
          )))) {
        iVar3 = node->width;
        break;
      }
      bVar7 = uVar6 < uVar5;
      node = node + 1;
      bVar8 = uVar6 != uVar5;
      uVar6 = uVar6 + 1;
    } while (bVar8);
  }
  if (!bVar7) {
    std::__cxx11::string::compare((char *)name_node);
    std::__cxx11::string::compare((char *)name_node);
    std::__cxx11::string::compare((char *)name_node);
    std::__cxx11::string::compare((char *)name_node);
    std::__cxx11::string::compare((char *)name_node);
    std::__cxx11::string::compare((char *)name_node);
    psVar4 = (string *)__cxa_allocate_exception(0x20);
    *(string **)psVar4 = psVar4 + 0x10;
    pcVar2 = (name_node->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>(psVar4,pcVar2,pcVar2 + name_node->_M_string_length);
    __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  return iVar3;
}

Assistant:

int node_width(string name_node, struct datanode *node, string type_name)	//tyoe_namme is passed to just output it in case of error
 {
	 int l = 0;
		 for (int i = 0; i < nodepointer; i++)
		 {
			 if (node[i].name == name_node)
			 {
				 return node[i].width;
			 }
		 }
		 
		 if (name_node != "gtn" && name_node !="ltn" && name_node!="eqt" && name_node != "Clk" && name_node!="Rst" && name_node !="1") {
			 try {
				 throw (name_node);
			 }
			 catch (string name_node) {
				 cout << " Node : "<<name_node<<" Not Declared of type "<<type_name;
			 }
		 }
		  
		
 }